

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpWatchDog.c
# Opt level: O1

qpWatchDog *
qpWatchDog_create(qpWatchDogFunc timeOutFunc,void *userPtr,int totalTimeLimitSecs,
                 int intervalTimeLimitSecs)

{
  qpWatchDog *arg;
  deUint64 dVar1;
  deThread dVar2;
  
  arg = (qpWatchDog *)deCalloc(0x38);
  if (arg != (qpWatchDog *)0x0) {
    arg->timeOutFunc = timeOutFunc;
    arg->timeOutUserPtr = userPtr;
    arg->totalTimeLimit = totalTimeLimitSecs;
    arg->intervalTimeLimit = intervalTimeLimitSecs;
    dVar1 = deGetMicroseconds();
    arg->resetTime = dVar1;
    arg->lastTouchTime = dVar1;
    arg->status = STATUS_THREAD_RUNNING;
    dVar2 = deThread_create(watchDogThreadFunc,arg,(deThreadAttributes *)0x0);
    arg->watchDogThread = dVar2;
    if (dVar2 != 0) {
      return arg;
    }
    deFree(arg);
  }
  return (qpWatchDog *)0x0;
}

Assistant:

qpWatchDog* qpWatchDog_create (qpWatchDogFunc timeOutFunc, void* userPtr, int totalTimeLimitSecs, int intervalTimeLimitSecs)
{
	/* Allocate & initialize. */
	qpWatchDog* dog = (qpWatchDog*)deCalloc(sizeof(qpWatchDog));
	if (!dog)
		return dog;

	DE_ASSERT(timeOutFunc);
	DE_ASSERT((totalTimeLimitSecs > 0) && (intervalTimeLimitSecs > 0));

	DBGPRINT(("qpWatchDog::create(%ds, %ds)\n", totalTimeLimitSecs, intervalTimeLimitSecs));

	dog->timeOutFunc		= timeOutFunc;
	dog->timeOutUserPtr		= userPtr;
	dog->totalTimeLimit		= totalTimeLimitSecs;
	dog->intervalTimeLimit	= intervalTimeLimitSecs;

	/* Reset (sets time values). */
	qpWatchDog_reset(dog);

	/* Initialize watchdog thread. */
	dog->status			= STATUS_THREAD_RUNNING;
	dog->watchDogThread = deThread_create(watchDogThreadFunc, dog, DE_NULL);
	if (!dog->watchDogThread)
	{
		deFree(dog);
		return DE_NULL;
	}

	return dog;
}